

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cyclichash.h
# Opt level: O1

unsigned_long_long __thiscall
CyclicHash<unsigned_long_long,unsigned_char>::
hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
          (CyclicHash<unsigned_long_long,unsigned_char> *this,
          deque<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  _Map_pointer ppuVar1;
  _Elt_pointer puVar2;
  _Map_pointer ppuVar3;
  ulong uVar4;
  uint uVar5;
  _Elt_pointer puVar6;
  ulong uVar7;
  ulong uVar8;
  byte *pbVar9;
  
  ppuVar1 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  puVar2 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  ppuVar3 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Deque_impl_data._M_start._M_node;
  puVar6 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Deque_impl_data._M_start._M_last +
           (long)((c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Deque_impl_data._M_finish._M_cur +
                 (((((ulong)((long)ppuVar1 - (long)ppuVar3) >> 3) - 1) +
                  (ulong)(ppuVar1 == (_Map_pointer)0x0)) * 0x200 -
                 (long)(c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                       .super__Deque_impl_data._M_finish._M_first));
  if (puVar6 == puVar2) {
    return 0;
  }
  uVar7 = (long)puVar2 -
          (long)(c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Deque_impl_data._M_start._M_first;
  uVar5 = 1;
  uVar8 = 0;
  uVar4 = 0;
  do {
    if (uVar7 < 0x200) {
      pbVar9 = puVar2 + uVar8;
    }
    else {
      uVar8 = (uVar7 >> 9) + 0xff80000000000000;
      if (0 < (long)uVar7) {
        uVar8 = uVar7 >> 9;
      }
      pbVar9 = ppuVar3[uVar8] + uVar7 + uVar8 * -0x200;
    }
    uVar4 = (uVar4 >> ((char)*(undefined4 *)(this + 0xc) - 1U & 0x3f) |
            (uVar4 & *(ulong *)(this + 0x810)) * 2) ^ *(ulong *)(this + (ulong)*pbVar9 * 8 + 0x10);
    uVar8 = (ulong)uVar5;
    uVar7 = uVar7 + 1;
    uVar5 = uVar5 + 1;
  } while (uVar8 < (ulong)((long)puVar6 - (long)puVar2));
  return uVar4;
}

Assistant:

hashvaluetype hash(container &c) {
    hashvaluetype answer(0);
    for (uint k = 0; k < c.size(); ++k) {
      fastleftshift1(answer);
      answer ^= hasher.hashvalues[static_cast<unsigned int>(c[k])];
    }
    return answer;
  }